

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexture2DArrayShadowGradOffset
               (ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float r;
  float *pfVar1;
  float lod;
  float fVar2;
  undefined1 local_20 [16];
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_20._8_8_ = p;
  p_local = (TexLookupParams *)c;
  pfVar1 = tcu::Vector<float,_4>::w(c->in);
  fVar2 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(p_local + 1));
  s = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  t = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(p_local + 1));
  r = *pfVar1;
  lod = computeLodFromGrad2DArray((ShaderEvalContext *)p_local);
  tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)local_20,(int)local_20._8_8_ + 4,0);
  fVar2 = texture2DArrayShadowOffset(c,fVar2,s,t,r,lod,(IVec2 *)local_20);
  pfVar1 = tcu::Vector<float,_4>::x(&p_local[10].scale);
  *pfVar1 = fVar2;
  return;
}

Assistant:

static void		evalTexture2DArrayShadowGradOffset	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DArrayShadowOffset(c, c.in[0].w(), c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGrad2DArray(c), p.offset.swizzle(0,1)); }